

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::setCheckable(QGroupBox *this,bool checkable)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  QGroupBoxPrivate *pQVar4;
  byte in_SIL;
  QWidget *in_RDI;
  QGroupBoxPrivate *unaff_retaddr;
  bool wasCheckable;
  QGroupBoxPrivate *d;
  QGroupBoxPrivate *in_stack_00000038;
  undefined7 in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  QWidget *pQVar5;
  undefined1 b;
  
  bVar2 = in_SIL & 1;
  pQVar5 = in_RDI;
  pQVar4 = d_func((QGroupBox *)0x5a4fb4);
  b = (undefined1)((ulong)pQVar5 >> 0x38);
  bVar1 = pQVar4->checkable;
  bVar3 = bVar1 & 1;
  pQVar4->checkable = (bool)(bVar2 & 1);
  if ((bVar2 & 1) == 0) {
    if (bVar3 != 0) {
      QWidget::setFocusPolicy
                ((QWidget *)(CONCAT17(bVar1,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
                 (FocusPolicy)((ulong)in_RDI >> 0x20));
      QGroupBoxPrivate::_q_setChildrenEnabled(unaff_retaddr,(bool)b);
      QWidget::updateGeometry((QWidget *)CONCAT17(bVar3,in_stack_ffffffffffffffe0));
    }
    QGroupBoxPrivate::_q_setChildrenEnabled(unaff_retaddr,(bool)b);
  }
  else {
    setChecked((QGroupBox *)CONCAT17(bVar2,in_stack_fffffffffffffff0),SUB81((ulong)pQVar4 >> 0x38,0)
              );
    if ((bVar3 & 1) == 0) {
      QWidget::setFocusPolicy
                ((QWidget *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                 (FocusPolicy)((ulong)in_RDI >> 0x20));
      QGroupBoxPrivate::_q_setChildrenEnabled(unaff_retaddr,(bool)b);
      QWidget::updateGeometry((QWidget *)CONCAT17(bVar3,in_stack_ffffffffffffffe0));
    }
  }
  if ((bVar3 & 1) != (bVar2 & 1)) {
    QGroupBoxPrivate::calculateFrame(in_stack_00000038);
    QWidget::update(in_RDI);
  }
  return;
}

Assistant:

void QGroupBox::setCheckable(bool checkable)
{
    Q_D(QGroupBox);

    bool wasCheckable = d->checkable;
    d->checkable = checkable;

    if (checkable) {
        setChecked(true);
        if (!wasCheckable) {
            setFocusPolicy(Qt::StrongFocus);
            d->_q_setChildrenEnabled(true);
            updateGeometry();
        }
    } else {
        if (wasCheckable) {
            setFocusPolicy(Qt::NoFocus);
            d->_q_setChildrenEnabled(true);
            updateGeometry();
        }
        d->_q_setChildrenEnabled(true);
    }

    if (wasCheckable != checkable) {
        d->calculateFrame();
        update();
    }
}